

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O3

bool __thiscall
cmDependsC::WriteDependencies
          (cmDependsC *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *makeDepends,ostream *internalDepends)

{
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *pqVar1;
  char cVar2;
  _Base_ptr p_Var3;
  _Elt_pointer pUVar4;
  pointer pcVar5;
  value_type *pvVar6;
  string *psVar7;
  cmGlobalGenerator *pcVar8;
  cmLocalUnixMakefileGenerator3 *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar9;
  bool bVar10;
  BOM BVar11;
  const_iterator cVar12;
  _Base_ptr p_Var13;
  iterator iVar14;
  long *plVar15;
  iterator iVar16;
  iterator iVar17;
  mapped_type *this_01;
  ostream *poVar18;
  _Rb_tree_node_base *p_Var19;
  ulong *puVar20;
  _Rb_tree_header *p_Var21;
  UnscannedEntry *inc;
  value_type *__x;
  string *in_base;
  string fullName;
  UnscannedEntry current;
  string dir;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scanned;
  string obj_i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependencies;
  string obj_m;
  int local_384;
  key_type local_380;
  string local_360;
  string local_340;
  ostream *local_320;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  undefined1 local_2f0 [32];
  _Base_ptr local_2d0;
  size_t local_2c8;
  cmDependsC *local_2c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2b8;
  ostream *local_2b0;
  string local_2a8;
  _Base_ptr local_288;
  _Base_ptr local_280;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>_>
  *local_278;
  RegularExpression *local_270;
  undefined1 local_268 [16];
  _Base_ptr local_258;
  _Rb_tree_node_base *local_250;
  _Rb_tree_node_base *local_248;
  size_t local_240;
  value_type local_238 [8];
  
  local_320 = makeDepends;
  local_2b0 = internalDepends;
  if (((sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
     ((sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent == (_Base_ptr)0x0
     )) {
    local_238[0].FileName._M_dataplus._M_p = (pointer)&local_238[0].FileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"Cannot scan dependencies without a source file.","");
    cmSystemTools::Error(&local_238[0].FileName);
  }
  else {
    if (obj->_M_string_length != 0) {
      local_250 = (_Rb_tree_node_base *)(local_268 + 8);
      local_268._8_4_ = 0;
      local_258 = (_Base_ptr)0x0;
      local_240 = 0;
      local_248 = local_250;
      cmOutputConverter::MaybeRelativeToTopBinDir
                (&local_2a8,
                 &(((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                  super_cmLocalGenerator.super_cmOutputConverter,obj);
      if ((&this->ValidDeps->_M_t ==
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)0x0) ||
         (cVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::find(&this->ValidDeps->_M_t,&local_2a8),
         (_Rb_tree_header *)cVar12._M_node == &(this->ValidDeps->_M_t)._M_impl.super__Rb_tree_header
         )) {
        local_384 = (int)(sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        local_318 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     *)&this->Encountered;
        local_2c0 = this;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_318);
        p_Var13 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var21 = &(sources->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var13 != p_Var21) {
          pqVar1 = &local_2c0->Unscanned;
          do {
            local_238[0].FileName._M_dataplus._M_p = (pointer)&local_238[0].FileName.field_2;
            local_238[0].FileName._M_string_length = 0;
            local_238[0].FileName.field_2._M_allocated_capacity =
                 local_238[0].FileName.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_238[0].QuotedLocation._M_dataplus._M_p =
                 (pointer)&local_238[0].QuotedLocation.field_2;
            local_238[0].QuotedLocation._M_string_length = 0;
            local_238[0].QuotedLocation.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::_M_assign((string *)local_238);
            std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
            push_back(&pqVar1->c,local_238);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      (local_318,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var13 + 1));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0].QuotedLocation._M_dataplus._M_p !=
                &local_238[0].QuotedLocation.field_2) {
              operator_delete(local_238[0].QuotedLocation._M_dataplus._M_p,
                              CONCAT71(local_238[0].QuotedLocation.field_2._M_allocated_capacity.
                                       _1_7_,local_238[0].QuotedLocation.field_2._M_local_buf[0]) +
                              1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
              operator_delete(local_238[0].FileName._M_dataplus._M_p,
                              local_238[0].FileName.field_2._M_allocated_capacity + 1);
            }
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
          } while ((_Rb_tree_header *)p_Var13 != p_Var21);
        }
        this = local_2c0;
        local_2f0._24_8_ = local_2f0 + 8;
        local_2f0._8_4_ = _S_red;
        local_2f0._16_8_ = (_Base_ptr)0x0;
        local_2c8 = 0;
        pqVar1 = &local_2c0->Unscanned;
        local_2b8 = &local_2c0->HeaderLocationCache;
        local_288 = &(local_2c0->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_270 = &local_2c0->IncludeRegexComplain;
        local_278 = &local_2c0->FileCache;
        local_280 = &(local_2c0->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header;
        psVar9 = &local_2c0->Encountered;
        local_2d0 = (_Base_ptr)local_2f0._24_8_;
        do {
          pUVar4 = (this->Unscanned).c.
                   super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          if ((this->Unscanned).c.
              super__Deque_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur == pUVar4) {
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2f0);
            goto LAB_004e2f1b;
          }
          local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
          pcVar5 = (pUVar4->FileName)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_360,pcVar5,pcVar5 + (pUVar4->FileName)._M_string_length);
          local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
          pcVar5 = (pUVar4->QuotedLocation)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_340,pcVar5,pcVar5 + (pUVar4->QuotedLocation)._M_string_length)
          ;
          std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
          pop_front(&pqVar1->c);
          local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
          local_380._M_string_length = 0;
          local_380.field_2._M_local_buf[0] = '\0';
          if ((0 < local_384) || (bVar10 = cmsys::SystemTools::FileIsFullPath(&local_360), bVar10))
          {
            bVar10 = cmsys::SystemTools::FileExists(&local_360,true);
            if (bVar10) goto LAB_004e2ac7;
          }
          else if ((local_340._M_string_length == 0) ||
                  (bVar10 = cmsys::SystemTools::FileExists(&local_340,true), !bVar10)) {
            iVar17 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find(&local_2b8->_M_t,&local_360);
            if (iVar17._M_node == local_288) {
              psVar7 = (this->super_cmDepends).IncludePath.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (in_base = (this->super_cmDepends).IncludePath.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; in_base != psVar7;
                  in_base = in_base + 1) {
                cmsys::SystemTools::CollapseFullPath(&local_238[0].FileName,&local_360,in_base);
                bVar10 = cmsys::SystemTools::FileExists(&local_238[0].FileName,true);
                if (bVar10) {
                  std::__cxx11::string::_M_assign((string *)&local_380);
                  this_01 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](local_2b8,&local_360);
                  std::__cxx11::string::operator=((string *)this_01,(string *)local_238);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
                    operator_delete(local_238[0].FileName._M_dataplus._M_p,
                                    local_238[0].FileName.field_2._M_allocated_capacity + 1);
                  }
                  break;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
                  operator_delete(local_238[0].FileName._M_dataplus._M_p,
                                  local_238[0].FileName.field_2._M_allocated_capacity + 1);
                }
              }
            }
            else {
              std::__cxx11::string::_M_assign((string *)&local_380);
            }
          }
          else {
LAB_004e2ac7:
            std::__cxx11::string::_M_assign((string *)&local_380);
          }
          if (local_380._M_string_length == 0) {
            bVar10 = cmsys::RegularExpression::find
                               (local_270,local_360._M_dataplus._M_p,&local_270->regmatch);
            if (!bVar10) {
              if (local_380._M_string_length != 0) goto LAB_004e2add;
              goto LAB_004e2b00;
            }
            std::operator+(&local_310,"Cannot find file \"",&local_360);
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_310);
            local_238[0].FileName._M_dataplus._M_p = (pointer)&local_238[0].FileName.field_2;
            puVar20 = (ulong *)(plVar15 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar20) {
              local_238[0].FileName.field_2._0_8_ = *puVar20;
              local_238[0].FileName.field_2._8_8_ = plVar15[3];
            }
            else {
              local_238[0].FileName.field_2._0_8_ = *puVar20;
              local_238[0].FileName._M_dataplus._M_p = (pointer)*plVar15;
            }
            local_238[0].FileName._M_string_length = plVar15[1];
            *plVar15 = (long)puVar20;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            cmSystemTools::Error(&local_238[0].FileName);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
              operator_delete(local_238[0].FileName._M_dataplus._M_p,
                              local_238[0].FileName.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_310._M_dataplus._M_p != &local_310.field_2) {
              operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1
                             );
            }
            bVar10 = false;
          }
          else {
LAB_004e2add:
            iVar14 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2f0,&local_380);
            if (iVar14._M_node == (_Base_ptr)(local_2f0 + 8)) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_2f0,&local_380);
              iVar16 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>_>
                       ::find(&local_278->_M_t,&local_380);
              if (iVar16._M_node == local_280) {
                std::ifstream::ifstream(local_238,local_380._M_dataplus._M_p,_S_in);
                if (((*(byte *)((long)&local_238[0].QuotedLocation._M_dataplus._M_p +
                               *(long *)(local_238[0].FileName._M_dataplus._M_p + -0x18)) & 5) == 0)
                   && (BVar11 = cmsys::FStream::ReadBOM((istream *)local_238), BVar11 < BOM_UTF16BE)
                   ) {
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_268,&local_380);
                  cmsys::SystemTools::GetFilenamePath(&local_310,&local_380);
                  Scan(this,(istream *)local_238,&local_310,&local_380);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_310._M_dataplus._M_p != &local_310.field_2) {
                    operator_delete(local_310._M_dataplus._M_p,
                                    local_310.field_2._M_allocated_capacity + 1);
                  }
                }
                std::ifstream::~ifstream(local_238);
              }
              else {
                *(undefined1 *)&iVar16._M_node[2]._M_right = 1;
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)local_268,&local_380);
                pvVar6 = (value_type *)iVar16._M_node[2]._M_parent;
                for (__x = *(value_type **)(iVar16._M_node + 2); __x != pvVar6; __x = __x + 1) {
                  iVar14 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_318,&__x->FileName);
                  if ((_Rb_tree_header *)iVar14._M_node ==
                      &(psVar9->_M_t)._M_impl.super__Rb_tree_header) {
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>(local_318,&__x->FileName);
                    std::
                    deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
                    push_back(&pqVar1->c,__x);
                  }
                }
              }
            }
LAB_004e2b00:
            local_384 = local_384 + -1;
            bVar10 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._M_dataplus._M_p != &local_380.field_2) {
            operator_delete(local_380._M_dataplus._M_p,
                            CONCAT71(local_380.field_2._M_allocated_capacity._1_7_,
                                     local_380.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_340._M_dataplus._M_p != &local_340.field_2) {
            operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
          }
        } while (bVar10);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2f0);
        bVar10 = false;
      }
      else {
        p_Var13 = *(_Base_ptr *)(cVar12._M_node + 2);
        p_Var3 = cVar12._M_node[2]._M_parent;
        local_238[0].FileName._M_dataplus._M_p = local_268;
        if (p_Var13 != p_Var3) {
          do {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::
            _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)local_268,(_Base_ptr)(local_268 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var13,
                       (_Alloc_node *)local_238);
            p_Var13 = p_Var13 + 1;
          } while (p_Var13 != p_Var3);
        }
LAB_004e2f1b:
        cmLocalUnixMakefileGenerator3::ConvertToMakefilePath
                  (&local_238[0].FileName,(this->super_cmDepends).LocalGenerator,&local_2a8);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_2b0,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
        local_360._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_360,1);
        if (local_240 != 0) {
          pcVar8 = (((this->super_cmDepends).LocalGenerator)->super_cmLocalCommonGenerator).
                   super_cmLocalGenerator.GlobalGenerator;
          cVar2 = *(char *)((long)&pcVar8[1].FindMakeProgramFile._M_string_length + 4);
          if (cVar2 == '\x01') {
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                (local_320,local_238[0].FileName._M_dataplus._M_p,
                                 local_238[0].FileName._M_string_length);
            local_360._M_dataplus._M_p._0_1_ = 0x3a;
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)&local_360,1);
          }
          if (local_250 != (_Rb_tree_node_base *)(local_268 + 8)) {
            p_Var19 = local_250;
            do {
              this_00 = (this->super_cmDepends).LocalGenerator;
              cmOutputConverter::MaybeRelativeToTopBinDir
                        ((string *)local_2f0,
                         &(this_00->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                          super_cmOutputConverter,(string *)(p_Var19 + 1));
              cmLocalUnixMakefileGenerator3::ConvertToMakefilePath
                        (&local_360,this_00,(string *)local_2f0);
              if ((undefined1 *)CONCAT71(local_2f0._1_7_,local_2f0[0]) != local_2f0 + 0x10) {
                operator_delete((undefined1 *)CONCAT71(local_2f0._1_7_,local_2f0[0]),
                                (ulong)(local_2f0._16_8_ + 1));
              }
              if (cVar2 == '\0') {
                poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                    (local_320,local_238[0].FileName._M_dataplus._M_p,
                                     local_238[0].FileName._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar18,": ",2);
                poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar18,local_360._M_dataplus._M_p,local_360._M_string_length);
                local_2f0[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                )0xa;
                std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)local_2f0,1);
              }
              else {
                local_2f0[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                )0x20;
                poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                    (local_320,(char *)local_2f0,1);
                poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar18,(char *)pcVar8[1].MakeSilentFlag.field_2.
                                                     _M_allocated_capacity,
                                     *(long *)((long)&pcVar8[1].MakeSilentFlag.field_2 + 8));
                local_2f0[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                )0x20;
                poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar18,(char *)local_2f0,1);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar18,local_360._M_dataplus._M_p,local_360._M_string_length);
              }
              local_2f0[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              )0x20;
              poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                  (local_2b0,(char *)local_2f0,1);
              poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar18,*(char **)(p_Var19 + 1),(long)p_Var19[1]._M_parent);
              local_2f0[0] = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              )0xa;
              std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)local_2f0,1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_360._M_dataplus._M_p != &local_360.field_2) {
                operator_delete(local_360._M_dataplus._M_p,
                                local_360.field_2._M_allocated_capacity + 1);
              }
              p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19);
            } while (p_Var19 != (_Rb_tree_node_base *)(local_268 + 8));
          }
          local_360._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(local_320,(char *)&local_360,1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
          operator_delete(local_238[0].FileName._M_dataplus._M_p,
                          local_238[0].FileName.field_2._M_allocated_capacity + 1);
        }
        bVar10 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_268);
      return bVar10;
    }
    local_238[0].FileName._M_dataplus._M_p = (pointer)&local_238[0].FileName.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_238,"Cannot scan dependencies without an object file.","");
    cmSystemTools::Error(&local_238[0].FileName);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0].FileName._M_dataplus._M_p != &local_238[0].FileName.field_2) {
    operator_delete(local_238[0].FileName._M_dataplus._M_p,
                    local_238[0].FileName.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmDependsC::WriteDependencies(const std::set<std::string>& sources,
                                   const std::string& obj,
                                   std::ostream& makeDepends,
                                   std::ostream& internalDepends)
{
  // Make sure this is a scanning instance.
  if (sources.empty() || sources.begin()->empty()) {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
  }
  if (obj.empty()) {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
  }

  std::set<std::string> dependencies;
  bool haveDeps = false;

  // Compute a path to the object file to write to the internal depend file.
  // Any existing content of the internal depend file has already been
  // loaded in ValidDeps with this path as a key.
  std::string obj_i = this->LocalGenerator->MaybeRelativeToTopBinDir(obj);

  if (this->ValidDeps != nullptr) {
    auto const tmpIt = this->ValidDeps->find(obj_i);
    if (tmpIt != this->ValidDeps->end()) {
      dependencies.insert(tmpIt->second.begin(), tmpIt->second.end());
      haveDeps = true;
    }
  }

  if (!haveDeps) {
    // Walk the dependency graph starting with the source file.
    int srcFiles = static_cast<int>(sources.size());
    this->Encountered.clear();

    for (std::string const& src : sources) {
      UnscannedEntry root;
      root.FileName = src;
      this->Unscanned.push(root);
      this->Encountered.insert(src);
    }

    std::set<std::string> scanned;
    while (!this->Unscanned.empty()) {
      // Get the next file to scan.
      UnscannedEntry current = this->Unscanned.front();
      this->Unscanned.pop();

      // If not a full path, find the file in the include path.
      std::string fullName;
      if ((srcFiles > 0) || cmSystemTools::FileIsFullPath(current.FileName)) {
        if (cmSystemTools::FileExists(current.FileName, true)) {
          fullName = current.FileName;
        }
      } else if (!current.QuotedLocation.empty() &&
                 cmSystemTools::FileExists(current.QuotedLocation, true)) {
        // The include statement producing this entry was a double-quote
        // include and the included file is present in the directory of
        // the source containing the include statement.
        fullName = current.QuotedLocation;
      } else {
        auto headerLocationIt =
          this->HeaderLocationCache.find(current.FileName);
        if (headerLocationIt != this->HeaderLocationCache.end()) {
          fullName = headerLocationIt->second;
        } else {
          for (std::string const& iPath : this->IncludePath) {
            // Construct the name of the file as if it were in the current
            // include directory.  Avoid using a leading "./".
            std::string tmpPath =
              cmSystemTools::CollapseFullPath(current.FileName, iPath);

            // Look for the file in this location.
            if (cmSystemTools::FileExists(tmpPath, true)) {
              fullName = tmpPath;
              this->HeaderLocationCache[current.FileName] = std::move(tmpPath);
              break;
            }
          }
        }
      }

      // Complain if the file cannot be found and matches the complain
      // regex.
      if (fullName.empty() &&
          this->IncludeRegexComplain.find(current.FileName)) {
        cmSystemTools::Error("Cannot find file \"" + current.FileName + "\".");
        return false;
      }

      // Scan the file if it was found and has not been scanned already.
      if (!fullName.empty() && (scanned.find(fullName) == scanned.end())) {
        // Record scanned files.
        scanned.insert(fullName);

        // Check whether this file is already in the cache
        auto fileIt = this->FileCache.find(fullName);
        if (fileIt != this->FileCache.end()) {
          fileIt->second.Used = true;
          dependencies.insert(fullName);
          for (UnscannedEntry const& inc : fileIt->second.UnscannedEntries) {
            if (this->Encountered.find(inc.FileName) ==
                this->Encountered.end()) {
              this->Encountered.insert(inc.FileName);
              this->Unscanned.push(inc);
            }
          }
        } else {

          // Try to scan the file.  Just leave it out if we cannot find
          // it.
          cmsys::ifstream fin(fullName.c_str());
          if (fin) {
            cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
            if (bom == cmsys::FStream::BOM_None ||
                bom == cmsys::FStream::BOM_UTF8) {
              // Add this file as a dependency.
              dependencies.insert(fullName);

              // Scan this file for new dependencies.  Pass the directory
              // containing the file to handle double-quote includes.
              std::string dir = cmSystemTools::GetFilenamePath(fullName);
              this->Scan(fin, dir, fullName);
            } else {
              // Skip file with encoding we do not implement.
            }
          }
        }
      }

      srcFiles--;
    }
  }

  // Write the dependencies to the output stream.  Makefile rules
  // written by the original local generator for this directory
  // convert the dependencies to paths relative to the home output
  // directory.  We must do the same here.
  std::string obj_m = this->LocalGenerator->ConvertToMakefilePath(obj_i);
  internalDepends << obj_i << '\n';
  if (!dependencies.empty()) {
    const auto& lineContinue = static_cast<cmGlobalUnixMakefileGenerator3*>(
                                 this->LocalGenerator->GetGlobalGenerator())
                                 ->LineContinueDirective;
    bool supportLongLineDepend = static_cast<cmGlobalUnixMakefileGenerator3*>(
                                   this->LocalGenerator->GetGlobalGenerator())
                                   ->SupportsLongLineDependencies();
    if (supportLongLineDepend) {
      makeDepends << obj_m << ':';
    }
    for (std::string const& dep : dependencies) {
      std::string dependee = this->LocalGenerator->ConvertToMakefilePath(
        this->LocalGenerator->MaybeRelativeToTopBinDir(dep));
      if (supportLongLineDepend) {
        makeDepends << ' ' << lineContinue << ' ' << dependee;
      } else {
        makeDepends << obj_m << ": " << dependee << '\n';
      }
      internalDepends << ' ' << dep << '\n';
    }
    makeDepends << '\n';
  }

  return true;
}